

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::DestructorOnlyDisposer<capnp::compiler::LineBreakTable>::disposeImpl
          (DestructorOnlyDisposer<capnp::compiler::LineBreakTable> *this,void *pointer)

{
  ArrayBuilder<unsigned_int>::dispose((ArrayBuilder<unsigned_int> *)pointer);
  return;
}

Assistant:

void disposeImpl(void* pointer) const override {
    reinterpret_cast<T*>(pointer)->~T();
  }